

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hack.c
# Opt level: O0

void dosinkfall(void)

{
  obj *poVar1;
  uint uVar2;
  uint uVar3;
  schar sVar4;
  int iVar5;
  char *pcVar6;
  long save_HLev;
  long save_ELev;
  obj *obj;
  
  uVar3 = u.uprops[0x12].intrinsic;
  uVar2 = u.uprops[0x12].extrinsic;
  if (((youmonst.data)->mlet == '\x05') || ((u.uprops[0x12].intrinsic & 0x4000000) != 0)) {
    pline("You wobble unsteadily for a moment.");
    uVar2 = u.uprops[0x12].extrinsic;
    uVar3 = u.uprops[0x12].intrinsic;
  }
  else {
    u.uprops[0x12].intrinsic = 0;
    u.uprops[0x12].extrinsic = 0;
    pline("You crash to the floor!");
    iVar5 = rn2(8);
    sVar4 = acurr(4);
    losehp(iVar5 + (0x19 - sVar4),"fell onto a sink",2);
    exercise(3,'\0');
    selftouch("Falling, you");
    for (save_ELev = (long)level->objects[u.ux][u.uy]; save_ELev != 0;
        save_ELev = *(long *)(save_ELev + 8)) {
      if ((*(char *)(save_ELev + 0x35) == '\x02') ||
         ((*(char *)(save_ELev + 0x35) == '\x06' &&
          (objects[*(short *)(save_ELev + 0x2a)].oc_subtyp != '\0')))) {
        pcVar6 = doname((obj *)save_ELev);
        pline("You fell on %s.",pcVar6);
        iVar5 = rnd(3);
        losehp(iVar5,"fell onto a sink",2);
        exercise(4,'\0');
      }
    }
  }
  u.uprops[0x12].intrinsic = uVar3;
  u.uprops[0x12].extrinsic = uVar2;
  poVar1 = uleft;
  u.uprops[0x12].extrinsic = u.uprops[0x12].extrinsic & 0xffffdfff;
  u.uprops[0x12].intrinsic = (u.uprops[0x12].intrinsic & 0xef000000) + 1;
  if ((uleft != (obj *)0x0) && (uleft->otyp == 0xaa)) {
    off_msg(uleft,'\0');
    Ring_off(poVar1);
  }
  poVar1 = uright;
  if ((uright != (obj *)0x0) && (uright->otyp == 0xaa)) {
    off_msg(uright,'\0');
    Ring_off(poVar1);
  }
  poVar1 = uarmf;
  if ((uarmf != (obj *)0x0) && (uarmf->otyp == 0x9c)) {
    Boots_off();
    off_msg(poVar1,'\0');
  }
  u.uprops[0x12].intrinsic = u.uprops[0x12].intrinsic - 1;
  return;
}

Assistant:

static void dosinkfall(void)
{
	struct obj *obj;

	if (is_floater(youmonst.data) || (HLevitation & FROMOUTSIDE)) {
	    pline("You wobble unsteadily for a moment.");
	} else {
	    long save_ELev = ELevitation, save_HLev = HLevitation;

	    /* fake removal of levitation in advance so that final
	       disclosure will be right in case this turns out to
	       be fatal; fortunately the fact that rings and boots
	       are really still worn has no effect on bones data */
	    ELevitation = HLevitation = 0L;
	    pline("You crash to the floor!");
	    losehp(rn1(8, 25 - (int)ACURR(A_CON)),
		   fell_on_sink, NO_KILLER_PREFIX);
	    exercise(A_DEX, FALSE);
	    selftouch("Falling, you");
	    for (obj = level->objects[u.ux][u.uy]; obj; obj = obj->nexthere)
		if (obj->oclass == WEAPON_CLASS || is_weptool(obj)) {
		    pline("You fell on %s.", doname(obj));
		    losehp(rnd(3), fell_on_sink, NO_KILLER_PREFIX);
		    exercise(A_CON, FALSE);
		}
	    ELevitation = save_ELev;
	    HLevitation = save_HLev;
	}

	ELevitation &= ~W_ARTI;
	HLevitation &= ~(I_SPECIAL|TIMEOUT);
	HLevitation++;
	if (uleft && uleft->otyp == RIN_LEVITATION) {
	    obj = uleft;
	    off_msg(obj, FALSE);
	    Ring_off(obj);
	}
	if (uright && uright->otyp == RIN_LEVITATION) {
	    obj = uright;
	    off_msg(obj, FALSE);
	    Ring_off(obj);
	}
	if (uarmf && uarmf->otyp == LEVITATION_BOOTS) {
	    obj = uarmf;
	    Boots_off();
	    off_msg(obj, FALSE);
	}
	HLevitation--;
}